

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_pcm_rb_data_source__on_read
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  uint sizeInFrames;
  ma_result mVar1;
  ulong uVar2;
  ulong uVar3;
  void *__dest;
  ulong frameCount_00;
  ma_uint64 mVar4;
  ma_uint32 mappedFrameCount;
  void *pMappedBuffer;
  uint local_44;
  ma_uint64 *local_40;
  void *local_38;
  
  mVar4 = 0;
  local_40 = pFramesRead;
  do {
    frameCount_00 = frameCount - mVar4;
    if (frameCount < mVar4 || frameCount_00 == 0) {
LAB_0015ef67:
      *local_40 = mVar4;
      return MA_SUCCESS;
    }
    uVar2 = 0xffffffff;
    if (frameCount_00 < 0xffffffff) {
      uVar2 = frameCount_00;
    }
    local_44 = (uint)uVar2;
    mVar1 = ma_pcm_rb_acquire_read((ma_pcm_rb *)pDataSource,&local_44,&local_38);
    sizeInFrames = local_44;
    if ((mVar1 != MA_SUCCESS) || (uVar2 = (ulong)local_44, local_44 == 0)) {
LAB_0015ef33:
      ma_silence_pcm_frames
                ((void *)((long)pFramesOut +
                         mVar4 * (*(int *)(&DAT_00176420 +
                                          (ulong)*(ma_format *)((long)pDataSource + 0x88) * 4) *
                                 *(ma_uint32 *)((long)pDataSource + 0x8c))),frameCount_00,
                 *(ma_format *)((long)pDataSource + 0x88),*(ma_uint32 *)((long)pDataSource + 0x8c));
      mVar4 = frameCount;
      goto LAB_0015ef67;
    }
    uVar3 = (ulong)(uint)(*(int *)(&DAT_00176420 + (ulong)*(uint *)((long)pDataSource + 0x88) * 4) *
                         *(int *)((long)pDataSource + 0x8c));
    __dest = (void *)(mVar4 * uVar3 + (long)pFramesOut);
    if (__dest != local_38) {
      memcpy(__dest,local_38,uVar3 * uVar2);
    }
    mVar1 = ma_pcm_rb_commit_read((ma_pcm_rb *)pDataSource,sizeInFrames);
    if (mVar1 != MA_SUCCESS) goto LAB_0015ef33;
    mVar4 = mVar4 + uVar2;
  } while( true );
}

Assistant:

static ma_result ma_pcm_rb_data_source__on_read(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    /* Since there's no notion of an end, we don't ever want to return MA_AT_END here. But it is possible to return 0. */
    ma_pcm_rb* pRB = (ma_pcm_rb*)pDataSource;
    ma_result result;
    ma_uint64 totalFramesRead;

    MA_ASSERT(pRB != NULL);

    /* We need to run this in a loop since the ring buffer itself may loop. */
    totalFramesRead = 0;
    while (totalFramesRead < frameCount) {
        void* pMappedBuffer;
        ma_uint32 mappedFrameCount;
        ma_uint64 framesToRead = frameCount - totalFramesRead;
        if (framesToRead > 0xFFFFFFFF) {
            framesToRead = 0xFFFFFFFF;
        }

        mappedFrameCount = (ma_uint32)framesToRead;
        result = ma_pcm_rb_acquire_read(pRB, &mappedFrameCount, &pMappedBuffer);
        if (result != MA_SUCCESS) {
            break;
        }

        if (mappedFrameCount == 0) {
            break;  /* <-- End of ring buffer. */
        }

        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), pMappedBuffer, mappedFrameCount, pRB->format, pRB->channels);

        result = ma_pcm_rb_commit_read(pRB, mappedFrameCount);
        if (result != MA_SUCCESS) {
            break;
        }

        totalFramesRead += mappedFrameCount;
    }

    /*
    There is no notion of an "end" in a ring buffer. If we didn't have enough data to fill the requested frame
    count we'll need to pad with silence. If we don't do this, totalFramesRead might equal 0 which will result
    in the data source layer at a higher level translating this to MA_AT_END which is incorrect for a ring buffer.
    */
    if (totalFramesRead < frameCount) {
        ma_silence_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), (frameCount - totalFramesRead), pRB->format, pRB->channels);
        totalFramesRead = frameCount;
    }

    *pFramesRead = totalFramesRead;
    return MA_SUCCESS;
}